

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

Relation dg::vr::RelationsAnalyzer::ICMPToRel(ICmpInst *icmp,bool assumption)

{
  byte in_SIL;
  Predicate pred;
  Predicate local_1c;
  Relation local_4;
  
  if ((in_SIL & 1) == 0) {
    local_1c = llvm::CmpInst::getInversePredicate((CmpInst *)0x1cf103);
  }
  else {
    local_1c = llvm::ICmpInst::getSignedPredicate((ICmpInst *)0x1cf0f3);
  }
  switch(local_1c) {
  case FIRST_ICMP_PREDICATE:
    local_4 = EQ;
    break;
  case ICMP_NE:
    local_4 = NE;
    break;
  case ICMP_UGT:
    local_4 = UGT;
    break;
  case ICMP_UGE:
    local_4 = UGE;
    break;
  case ICMP_ULT:
    local_4 = ULT;
    break;
  case ICMP_ULE:
    local_4 = ULE;
    break;
  case ICMP_SGT:
    local_4 = SGT;
    break;
  case ICMP_SGE:
    local_4 = SGE;
    break;
  case ICMP_SLT:
    local_4 = SLT;
    break;
  case ICMP_SLE:
    local_4 = SLE;
    break;
  default:
    abort();
  }
  return local_4;
}

Assistant:

RelationsAnalyzer::Relation
RelationsAnalyzer::ICMPToRel(const llvm::ICmpInst *icmp, bool assumption) {
    llvm::ICmpInst::Predicate pred = assumption ? icmp->getSignedPredicate()
                                                : icmp->getInversePredicate();

    switch (pred) {
    case llvm::ICmpInst::Predicate::ICMP_EQ:
        return Relation::EQ;
    case llvm::ICmpInst::Predicate::ICMP_NE:
        return Relation::NE;
    case llvm::ICmpInst::Predicate::ICMP_ULE:
        return Relation::ULE;
    case llvm::ICmpInst::Predicate::ICMP_SLE:
        return Relation::SLE;
    case llvm::ICmpInst::Predicate::ICMP_ULT:
        return Relation::ULT;
    case llvm::ICmpInst::Predicate::ICMP_SLT:
        return Relation::SLT;
    case llvm::ICmpInst::Predicate::ICMP_UGE:
        return Relation::UGE;
    case llvm::ICmpInst::Predicate::ICMP_SGE:
        return Relation::SGE;
    case llvm::ICmpInst::Predicate::ICMP_UGT:
        return Relation::UGT;
    case llvm::ICmpInst::Predicate::ICMP_SGT:
        return Relation::SGT;
    default:
#ifndef NDEBUG
        llvm::errs() << "Unhandled predicate in" << *icmp << "\n";
#endif
        abort();
    }
}